

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityOutputTest.cpp
# Opt level: O0

void __thiscall
TEST_TeamCityOutputTest_TestGroupEscaped_End_Test::
~TEST_TeamCityOutputTest_TestGroupEscaped_End_Test
          (TEST_TeamCityOutputTest_TestGroupEscaped_End_Test *this)

{
  TEST_TeamCityOutputTest_TestGroupEscaped_End_Test *this_local;
  
  ~TEST_TeamCityOutputTest_TestGroupEscaped_End_Test(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

TEST(TeamCityOutputTest, TestGroupEscaped_End)
{
	tst->setGroupName("'[]\n\r");
	result->currentGroupStarted(tst);
	result->currentGroupEnded(tst);
	const char* expected =
		"##teamcity[testSuiteStarted name='|'|[|]|n|r']\n"
		"##teamcity[testSuiteFinished name='|'|[|]|n|r']\n";
	STRCMP_EQUAL(expected, mock->getOutput().asCharString());
}